

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructCmpxchg
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructCmpxchg *curr,
          optional<wasm::HeapType> ht)

{
  Struct *pSVar1;
  _Storage<wasm::HeapType,_true> local_30;
  optional<wasm::HeapType> ht_local;
  
  local_30 = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_30._M_value = wasm::Type::getHeapType(&curr->ref->type);
    ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  pSVar1 = HeapType::getStruct(&local_30._M_value);
  if ((ulong)curr->index <
      (ulong)((long)(pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    if (((uint)(0x7c < (ulong)local_30) * 4 + 3 & local_30._0_4_) == 0) {
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,&curr->ref,(Type)((ulong)local_30 | 2));
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,&curr->expected,
                 (Type)(pSVar1->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start[curr->index].type.id);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,&curr->replacement,
                 (Type)(pSVar1->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start[curr->index].type.id);
      return;
    }
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  __assert_fail("curr->index < fields.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x39b,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructCmpxchg(StructCmpxchg *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr,
                          std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    const auto& fields = ht->getStruct().fields;
    assert(curr->index < fields.size());
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->expected, fields[curr->index].type);
    note(&curr->replacement, fields[curr->index].type);
  }